

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmTim.c
# Opt level: O2

void Sfm_TimCriticalPath_int(Sfm_Tim_t *p,Abc_Obj_t *pObj,Vec_Int_t *vPath,int SlackMax)

{
  Abc_Ntk_t *pAVar1;
  Abc_Obj_t *pNode;
  int iVar2;
  uint uVar3;
  int iVar4;
  int Fill;
  Vec_Int_t *p_00;
  long lVar5;
  
  p_00 = &pObj->pNtk->vTravIds;
  iVar4 = pObj->Id;
  Vec_IntFillExtra(p_00,iVar4 + 1,(int)vPath);
  iVar2 = Vec_IntEntry(p_00,iVar4);
  pAVar1 = pObj->pNtk;
  iVar4 = pAVar1->nTravIds;
  if (iVar2 != iVar4) {
    iVar2 = pObj->Id;
    Vec_IntFillExtra(&pAVar1->vTravIds,iVar2 + 1,Fill);
    if (((long)iVar2 < 0) || ((pAVar1->vTravIds).nSize <= iVar2)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    (pAVar1->vTravIds).pArray[iVar2] = iVar4;
    if ((*(uint *)&pObj->field_0x14 & 0xf) != 7) {
      __assert_fail("Abc_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmTim.c"
                    ,0xa0,"void Sfm_TimCriticalPath_int(Sfm_Tim_t *, Abc_Obj_t *, Vec_Int_t *, int)"
                   );
    }
    for (lVar5 = 0; iVar4 = (pObj->vFanins).nSize, lVar5 < iVar4; lVar5 = lVar5 + 1) {
      pNode = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar5]];
      uVar3 = *(uint *)&pNode->field_0x14 & 0xf;
      if (((uVar3 != 2) && (uVar3 != 5)) && ((pNode->vFanins).nSize != 0)) {
        if (uVar3 != 7) {
          __assert_fail("Abc_ObjIsNode(pNext)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmTim.c"
                        ,0xa5,
                        "void Sfm_TimCriticalPath_int(Sfm_Tim_t *, Abc_Obj_t *, Vec_Int_t *, int)");
        }
        iVar4 = Sfm_TimSlack(p,pNode);
        if (iVar4 <= SlackMax) {
          Sfm_TimCriticalPath_int(p,pNode,vPath,SlackMax);
        }
      }
    }
    if (0 < iVar4) {
      Vec_IntPush(vPath,pObj->Id);
      return;
    }
  }
  return;
}

Assistant:

void Sfm_TimCriticalPath_int( Sfm_Tim_t * p, Abc_Obj_t * pObj, Vec_Int_t * vPath, int SlackMax )
{
    Abc_Obj_t * pNext; int i;
    if ( Abc_NodeIsTravIdCurrent( pObj ) )
        return;
    Abc_NodeSetTravIdCurrent( pObj );
    assert( Abc_ObjIsNode(pObj) );
    Abc_ObjForEachFanin( pObj, pNext, i )
    {
        if ( Abc_ObjIsCi(pNext) || Abc_ObjFaninNum(pNext) == 0 )
            continue;
        assert( Abc_ObjIsNode(pNext) );
        if ( Sfm_TimSlack(p, pNext) <= SlackMax )
            Sfm_TimCriticalPath_int( p, pNext, vPath, SlackMax );
    }
    if ( Abc_ObjFaninNum(pObj) > 0 )
        Vec_IntPush( vPath, Abc_ObjId(pObj) );
}